

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall chrono::robosimian::RoboSimian::Translate(RoboSimian *this,ChVector<double> *shift)

{
  RS_Sled *this_00;
  
  RS_Chassis::Translate
            ((this->m_chassis).
             super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             shift);
  this_00 = (this->m_sled).
            super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (RS_Sled *)0x0) {
    RS_Sled::Translate(this_00,shift);
  }
  RS_Limb::Translate((((this->m_limbs).
                       super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,shift);
  RS_Limb::Translate((this->m_limbs).
                     super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].
                     super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,shift);
  RS_Limb::Translate((this->m_limbs).
                     super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,shift);
  RS_Limb::Translate((this->m_limbs).
                     super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[3].
                     super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,shift);
  return;
}

Assistant:

void RoboSimian::Translate(const ChVector<>& shift) {
    m_chassis->Translate(shift);
    if (m_sled)
        m_sled->Translate(shift);
    m_limbs[FR]->Translate(shift);
    m_limbs[RR]->Translate(shift);
    m_limbs[RL]->Translate(shift);
    m_limbs[FL]->Translate(shift);
}